

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastToBlob::Operation<duckdb::string_t,duckdb::string_t>
          (TryCastToBlob *this,string_t input,string_t *result,Vector *result_vector,
          CastParameters *parameters)

{
  bool bVar1;
  anon_union_16_2_67f50693_for_value *this_00;
  idx_t len;
  char *pcVar2;
  anon_struct_16_3_d7536bce_for_pointer aVar3;
  string_t str;
  string_t str_00;
  idx_t result_size;
  Vector *local_30;
  
  this_00 = input.value._8_8_;
  str.value._0_8_ = input.value._0_8_;
  str.value.pointer.ptr = (char *)&local_30;
  bVar1 = Blob::TryGetBlobSize
                    ((Blob *)this,str,(idx_t *)result_vector,(CastParameters *)result_vector);
  if (bVar1) {
    aVar3 = (anon_struct_16_3_d7536bce_for_pointer)
            StringVector::EmptyString((StringVector *)result,local_30,len);
    this_00->pointer = aVar3;
    pcVar2 = aVar3.ptr;
    if (aVar3.length < 0xd) {
      pcVar2 = (this_00->pointer).prefix;
    }
    str_00.value.pointer.ptr = pcVar2;
    str_00.value._0_8_ = str.value._0_8_;
    Blob::ToBlob((Blob *)this,str_00,(data_ptr_t)(this_00->pointer).prefix);
    string_t::Finalize((string_t *)&this_00->pointer);
  }
  return bVar1;
}

Assistant:

bool TryCastToBlob::Operation(string_t input, string_t &result, Vector &result_vector, CastParameters &parameters) {
	idx_t result_size;
	if (!Blob::TryGetBlobSize(input, result_size, parameters)) {
		return false;
	}

	result = StringVector::EmptyString(result_vector, result_size);
	Blob::ToBlob(input, data_ptr_cast(result.GetDataWriteable()));
	result.Finalize();
	return true;
}